

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotations.cpp
# Opt level: O2

void __thiscall
snestistics::AnnotationResolver::add_vector_comment
          (AnnotationResolver *this,RomAccessor *rom,char *comment,uint16_t target_at)

{
  ushort *puVar1;
  undefined6 in_register_0000000a;
  value_type local_88;
  
  puVar1 = (ushort *)RomAccessor::evalPtr(rom,(Pointer)CONCAT62(in_register_0000000a,target_at));
  local_88.name._M_dataplus._M_p = (pointer)&local_88.name.field_2;
  local_88.name._M_string_length = 0;
  local_88.name.field_2._M_local_buf[0] = '\0';
  local_88.comment._M_dataplus._M_p = (pointer)&local_88.comment.field_2;
  local_88.comment._M_string_length = 0;
  local_88.comment.field_2._M_local_buf[0] = '\0';
  local_88.comment_is_multiline = false;
  local_88.useComment._M_dataplus._M_p = (pointer)&local_88.useComment.field_2;
  local_88.useComment._M_string_length = 0;
  local_88.useComment.field_2._M_local_buf[0] = '\0';
  local_88.type = ANNOTATION_LINE;
  local_88.startOfRange = (Pointer)*puVar1;
  local_88.endOfRange = local_88.startOfRange;
  std::__cxx11::string::assign((char *)&local_88.comment);
  local_88.comment_is_multiline = false;
  std::vector<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>::push_back
            (&this->_annotations,&local_88);
  Annotation::~Annotation(&local_88);
  return;
}

Assistant:

void AnnotationResolver::add_vector_comment(const RomAccessor &rom, const char * const comment, const uint16_t target_at) {
	uint16_t target = *(uint16_t*)rom.evalPtr(target_at);
	Annotation a;
	a.type = ANNOTATION_LINE;
	a.startOfRange = a.endOfRange = target;
	a.comment = comment;
	a.comment_is_multiline = false;
	_annotations.push_back(a);
}